

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.cpp
# Opt level: O3

bool __thiscall DTreeParenthoodPropagator::propagate(DTreeParenthoodPropagator *this)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_header *p_Var2;
  Tint *pTVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  _Rb_tree_color _Var7;
  IntVar *pIVar8;
  BoolView *pBVar9;
  bool bVar10;
  int iVar11;
  _Base_ptr p_Var12;
  long lVar13;
  int *pt_1;
  int *pt;
  TrailElem local_40;
  
  p_Var12 = (this->parenthood_fixed)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->parenthood_fixed)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var12 != p_Var2) {
    do {
      iVar11 = (*(this->super_DTreePropagator).super_DReachabilityPropagator.super_GraphPropagator.
                 super_Propagator._vptr_Propagator[0x1b])(this,(ulong)p_Var12[1]._M_color);
      if ((char)iVar11 == '\0') {
        return false;
      }
      p_Var1 = p_Var12 + 1;
      uVar4 = *(uint *)(*(long *)&(this->super_DTreePropagator).super_DReachabilityPropagator.
                                  super_GraphPropagator.endnodes.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[(int)p_Var1->_M_color].
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data + 4);
      pIVar8 = (this->parents).data[uVar4];
      uVar5 = (pIVar8->min).v;
      uVar6 = (pIVar8->max).v;
      iVar11 = 1;
      if (uVar5 != uVar6) {
        iVar11 = 2;
        if ((int)((long)(int)uVar5 + 1) < (int)uVar6) {
          lVar13 = 0;
          do {
            iVar11 = iVar11 + pIVar8->vals[lVar13 + (long)(int)uVar5 + 1].v;
            lVar13 = lVar13 + 1;
          } while (~uVar5 + uVar6 != (int)lVar13);
        }
      }
      pTVar3 = this->dom_size + (int)uVar4;
      local_40.x = pTVar3->v;
      local_40.sz = 4;
      local_40.pt = &pTVar3->v;
      vec<TrailElem>::push(&engine.trail,&local_40);
      pTVar3->v = iVar11;
      _Var7 = p_Var1->_M_color;
      if ((this->super_DTreePropagator).super_DReachabilityPropagator.last_state_e[(int)_Var7].v !=
          0) {
        pBVar9 = (this->super_DTreePropagator).super_DReachabilityPropagator.super_GraphPropagator.
                 es.data;
        if ((sat.assigns.data[(uint)pBVar9[_Var7].v] != '\0') &&
           ((uint)pBVar9[_Var7].s * -2 + 1 == (int)sat.assigns.data[(uint)pBVar9[_Var7].v])) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &(this->super_DTreePropagator).super_DReachabilityPropagator.new_edge,
                     (int *)p_Var1);
        }
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != p_Var2);
  }
  p_Var12 = (this->parenthood_abandon)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->parenthood_abandon)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var12 != p_Var2) {
    do {
      iVar11 = (*(this->super_DTreePropagator).super_DReachabilityPropagator.super_GraphPropagator.
                 super_Propagator._vptr_Propagator[0x1a])(this,(ulong)p_Var12[1]._M_color);
      if ((char)iVar11 == '\0') {
        return false;
      }
      p_Var1 = p_Var12 + 1;
      uVar4 = *(uint *)(*(long *)&(this->super_DTreePropagator).super_DReachabilityPropagator.
                                  super_GraphPropagator.endnodes.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[(int)p_Var1->_M_color].
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data + 4);
      pIVar8 = (this->parents).data[uVar4];
      uVar5 = (pIVar8->min).v;
      uVar6 = (pIVar8->max).v;
      iVar11 = 1;
      if (uVar5 != uVar6) {
        iVar11 = 2;
        if ((int)((long)(int)uVar5 + 1) < (int)uVar6) {
          lVar13 = 0;
          do {
            iVar11 = iVar11 + pIVar8->vals[lVar13 + (long)(int)uVar5 + 1].v;
            lVar13 = lVar13 + 1;
          } while (~uVar5 + uVar6 != (int)lVar13);
        }
      }
      pTVar3 = this->dom_size + (int)uVar4;
      local_40.x = pTVar3->v;
      local_40.sz = 4;
      local_40.pt = &pTVar3->v;
      vec<TrailElem>::push(&engine.trail,&local_40);
      pTVar3->v = iVar11;
      if ((this->super_DTreePropagator).super_DReachabilityPropagator.last_state_e
          [(int)p_Var1->_M_color].v != 1) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &(this->super_DTreePropagator).super_DReachabilityPropagator.rem_edge,
                   (int *)p_Var1);
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != p_Var2);
  }
  bVar10 = DTreePropagator::propagate(&this->super_DTreePropagator);
  return bVar10;
}

Assistant:

bool DTreeParenthoodPropagator::propagate() {
	std::set<int>::iterator it;
	//*
	for (it = parenthood_fixed.begin(); it != parenthood_fixed.end(); ++it) {
		if (!propagateNewParent(*it)) {
			if (DEBUG) {
				std::cout << "False " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
		dom_size[getHead(*it)] = parents[getHead(*it)]->size();
		if (last_state_e[*it] != VT_IN) {
			assert(getHead(*it) == getTail(*it) || getEdgeVar(*it).isFixed());
			assert(getHead(*it) == getTail(*it) || getEdgeVar(*it).isTrue());
			if (getEdgeVar(*it).isFixed() && getEdgeVar(*it).isTrue()) {
				new_edge.insert(*it);
			}
		}
	}

	for (it = parenthood_abandon.begin(); it != parenthood_abandon.end(); ++it) {
		if (!propagateRemParent(*it)) {
			if (DEBUG) {
				std::cout << "False " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
		dom_size[getHead(*it)] = parents[getHead(*it)]->size();
		if (last_state_e[*it] != VT_OUT) {
			assert(getEdgeVar(*it).isFixed());
			assert(getEdgeVar(*it).isFalse());
			rem_edge.insert(*it);
		}
	}
	//*/

	if (!DTreePropagator::propagate()) {
		if (DEBUG) {
			std::cout << "False " << __FILE__ << __LINE__ << '\n';
		}
		return false;
	}

	return true;
}